

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int read_and_check_crc(spng_ctx *ctx)

{
  uint32_t uVar1;
  int iVar2;
  int ret;
  spng_ctx *ctx_local;
  
  if (ctx == (spng_ctx *)0x0) {
    ctx_local._4_4_ = 0x50;
  }
  else {
    ctx_local._4_4_ = read_data(ctx,4);
    if (ctx_local._4_4_ == 0) {
      uVar1 = read_u32(ctx->data);
      (ctx->current_chunk).crc = uVar1;
      if ((*(ushort *)&ctx->field_0xcc >> 7 & 1) == 0) {
        if (ctx->cur_actual_crc == (ctx->current_chunk).crc) {
          ctx_local._4_4_ = 0;
        }
        else {
          iVar2 = is_critical_chunk(&ctx->current_chunk);
          if (iVar2 == 0) {
            if (ctx->crc_action_ancillary == 2) {
              return 0;
            }
            if (ctx->crc_action_ancillary == 1) {
              return -1;
            }
          }
          else if (ctx->crc_action_critical == 2) {
            return 0;
          }
          ctx_local._4_4_ = 0x12;
        }
      }
      else {
        ctx_local._4_4_ = 0;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static inline int read_and_check_crc(spng_ctx *ctx)
{
    if(ctx == NULL) return SPNG_EINTERNAL;

    int ret;
    ret = read_data(ctx, 4);
    if(ret) return ret;

    ctx->current_chunk.crc = read_u32(ctx->data);

    if(ctx->skip_crc) return 0;

    if(ctx->cur_actual_crc != ctx->current_chunk.crc)
    {
        if(is_critical_chunk(&ctx->current_chunk))
        {
            if(ctx->crc_action_critical == SPNG_CRC_USE) return 0;
        }
        else
        {
            if(ctx->crc_action_ancillary == SPNG_CRC_USE) return 0;
            if(ctx->crc_action_ancillary == SPNG_CRC_DISCARD) return -SPNG_CRC_DISCARD;
        }

        return SPNG_ECHUNK_CRC;
    }

    return 0;
}